

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Projection.cpp
# Opt level: O0

void __thiscall
Projection::doMLMGNodalProjection
          (Projection *this,int c_lev,int nlevel,
          Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *vel,
          Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *phi,
          Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *sig,
          Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *rhcc,
          Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *rhnd,Real rel_tol,
          Real abs_tol,bool increment_gp,MultiFab *sync_resid_crse,MultiFab *sync_resid_fine,
          bool doing_initial_vortproj)

{
  array<amrex::LinOpBCType,_3UL> a_bc_hi;
  __normal_iterator<amrex::MultiFab_*const_*,_std::vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>_>
  __last;
  __normal_iterator<amrex::MultiFab_*const_*,_std::vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>_>
  __last_00;
  array<amrex::LinOpBCType,_3UL> a_bc_lo;
  bool bVar1;
  Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_> *a_S_nd;
  MultiFab **ppMVar2;
  Geometry *pGVar3;
  reference pvVar4;
  NodalProjector *pNVar5;
  Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_> *a_sigma;
  LPInfo *a_lpinfo;
  Geometry *__dest;
  FabArrayBase *this_00;
  MLNodeLaplacian *pMVar6;
  MLMG *this_01;
  AmrLevel **ppAVar7;
  MultiFab *dst;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  IntVect IVar8;
  byte in_stack_00000018;
  Real in_stack_00000020;
  MultiFab *in_stack_00000028;
  byte in_stack_00000030;
  Real *time;
  MultiFab *Gp;
  NavierStokesBase *ns;
  int lev_1;
  Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> gradphi;
  NodalProjector nodal_projector;
  Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> rhcc_rebase;
  Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_> rhnd_rebase;
  Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> sigma_rebase;
  Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> vel_rebase;
  Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> phi_rebase;
  LPInfo info;
  int lev;
  Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_> mg_dmap;
  Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> mg_grids;
  Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> mg_geom;
  int idim;
  array<amrex::LinOpBCType,_3UL> mlmg_hibc;
  array<amrex::LinOpBCType,_3UL> mlmg_lobc;
  Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_> phi_test;
  Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_> vel_test;
  int f_lev;
  BoxArray *in_stack_fffffffffffff918;
  NodalProjector *this_02;
  int in_stack_fffffffffffff920;
  int in_stack_fffffffffffff924;
  __normal_iterator<amrex::MultiFab_*const_*,_std::vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>_>
  in_stack_fffffffffffff928;
  __normal_iterator<amrex::MultiFab_*const_*,_std::vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>_>
  in_stack_fffffffffffff930;
  LinOpBCType in_stack_fffffffffffff938;
  int in_stack_fffffffffffff93c;
  __normal_iterator<amrex::MultiFab_*const_*,_std::vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>_>
  in_stack_fffffffffffff940;
  undefined4 in_stack_fffffffffffff948;
  LinOpBCType in_stack_fffffffffffff94c;
  undefined8 in_stack_fffffffffffff950;
  Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *in_stack_fffffffffffff958;
  Real in_stack_fffffffffffff960;
  Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *a_phi;
  NodalProjector *this_03;
  Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *in_stack_fffffffffffff998;
  Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *a_geom;
  Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *a_vel;
  Real local_5f8;
  Real *local_5f0;
  NodalProjector *local_5e8;
  MultiFab *local_5e0;
  int local_5d4;
  undefined8 local_5b8;
  int local_5b0;
  int local_540 [3];
  undefined8 local_530;
  int local_528;
  undefined8 local_520;
  int local_518;
  element_type *local_510;
  undefined4 local_508;
  undefined8 local_500;
  int local_4f8;
  element_type *local_4f0;
  undefined4 local_4e8;
  char *in_stack_fffffffffffffb38;
  int in_stack_fffffffffffffb44;
  undefined4 in_stack_fffffffffffffb48;
  int in_stack_fffffffffffffb4c;
  int in_stack_fffffffffffffb50;
  int in_stack_fffffffffffffb54;
  Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *in_stack_fffffffffffffb58;
  int in_stack_fffffffffffffb60;
  int in_stack_fffffffffffffb64;
  Projection *in_stack_fffffffffffffb68;
  AmrLevel *in_stack_fffffffffffffb70;
  int in_stack_fffffffffffffb80;
  undefined1 local_2b0 [104];
  MultiFab **local_248;
  MultiFab **local_240;
  MultiFab **local_238;
  MultiFab **local_230;
  MultiFab **local_228;
  MultiFab **local_200;
  pointer local_1f8;
  pointer local_1f0;
  pointer local_1e8;
  pointer local_1e0;
  LPInfo local_1c0;
  LinOpBCType local_1a0;
  Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> local_199;
  Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> local_179 [3];
  element_type *local_130;
  undefined4 local_128;
  uint local_124;
  uint local_120 [20];
  int local_d0;
  byte local_ca;
  byte local_c9;
  int local_a0;
  uint *local_90;
  undefined8 local_88;
  undefined4 local_7c;
  char *local_78;
  char *local_70;
  undefined8 local_68;
  undefined4 local_5c;
  char *local_58;
  char *local_50;
  uint *local_48;
  int local_3c;
  long local_38;
  int local_2c;
  long local_28;
  int local_1c;
  long local_18;
  int local_c;
  long local_8;
  
  local_c9 = in_stack_00000018 & 1;
  local_ca = in_stack_00000030 & 1;
  local_d0 = in_ESI + -1 + in_EDX;
  local_a0 = in_EDX;
  std::allocator<amrex::MultiFab>::allocator((allocator<amrex::MultiFab> *)0x82b60d);
  amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>::vector
            ((Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_> *)
             CONCAT44(in_stack_fffffffffffff924,in_stack_fffffffffffff920),
             (size_type)in_stack_fffffffffffff918,(allocator_type *)0x82b62a);
  std::allocator<amrex::MultiFab>::~allocator((allocator<amrex::MultiFab> *)0x82b639);
  a_S_nd = (Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_> *)
           (long)local_a0;
  std::allocator<amrex::MultiFab>::allocator((allocator<amrex::MultiFab> *)0x82b65e);
  amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>::vector
            ((Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_> *)
             CONCAT44(in_stack_fffffffffffff924,in_stack_fffffffffffff920),
             (size_type)in_stack_fffffffffffff918,(allocator_type *)0x82b67b);
  std::allocator<amrex::MultiFab>::~allocator((allocator<amrex::MultiFab> *)0x82b68a);
  bVar1 = std::vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::empty
                    ((vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)
                     in_stack_fffffffffffff930._M_current);
  if (!bVar1) {
    ppMVar2 = amrex::Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::operator[]
                        ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)
                         CONCAT44(in_stack_fffffffffffff924,in_stack_fffffffffffff920),
                         (size_type)in_stack_fffffffffffff918);
    amrex::FabArrayBase::boxArray((FabArrayBase *)*ppMVar2);
    local_120[0] = (uint)amrex::BoxArray::ixType(in_stack_fffffffffffff918);
    local_90 = local_120;
    if (local_120[0] != 0) {
      local_50 = "rhcc[c_lev]->boxArray().ixType().cellCentered()";
      local_58 = 
      "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/IAMR/Source/Projection.cpp"
      ;
      local_5c = 0x990;
      local_68 = 0;
      amrex::Assert_host((char *)CONCAT44(in_stack_fffffffffffffb54,in_stack_fffffffffffffb50),
                         (char *)CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48),
                         in_stack_fffffffffffffb44,in_stack_fffffffffffffb38);
    }
  }
  bVar1 = std::vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::empty
                    ((vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)
                     in_stack_fffffffffffff930._M_current);
  if (!bVar1) {
    ppMVar2 = amrex::Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::operator[]
                        ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)
                         CONCAT44(in_stack_fffffffffffff924,in_stack_fffffffffffff920),
                         (size_type)in_stack_fffffffffffff918);
    amrex::FabArrayBase::boxArray((FabArrayBase *)*ppMVar2);
    local_124 = (uint)amrex::BoxArray::ixType(in_stack_fffffffffffff918);
    local_48 = &local_124;
    if (local_124 != 7) {
      local_70 = "rhnd[c_lev]->boxArray().ixType().nodeCentered()";
      local_78 = 
      "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/IAMR/Source/Projection.cpp"
      ;
      local_7c = 0x993;
      local_88 = 0;
      amrex::Assert_host((char *)CONCAT44(in_stack_fffffffffffffb54,in_stack_fffffffffffffb50),
                         (char *)CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48),
                         in_stack_fffffffffffffb44,in_stack_fffffffffffffb38);
    }
  }
  set_boundary_velocity
            (in_stack_fffffffffffffb68,in_stack_fffffffffffffb64,in_stack_fffffffffffffb60,
             in_stack_fffffffffffffb58,SUB41((uint)in_stack_fffffffffffffb54 >> 0x18,0));
  for (local_179[2].super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
       super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
       super__Vector_impl_data._M_finish._1_4_ = 0;
      (int)local_179[2].super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
           super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
           super__Vector_impl_data._M_finish._1_4_ < 3;
      local_179[2].super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
      super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
      super__Vector_impl_data._M_finish._1_4_ =
           local_179[2].super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
           super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
           super__Vector_impl_data._M_finish._1_4_ + 1) {
    pGVar3 = amrex::AmrMesh::Geom
                       ((AmrMesh *)CONCAT44(in_stack_fffffffffffff924,in_stack_fffffffffffff920),
                        (int)((ulong)in_stack_fffffffffffff918 >> 0x20));
    bVar1 = amrex::Geometry::isPeriodic
                      (pGVar3,local_179[2].
                              super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                              super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish._1_4_);
    if (bVar1) {
      pvVar4 = std::array<amrex::LinOpBCType,_3UL>::operator[]
                         ((array<amrex::LinOpBCType,_3UL> *)
                          CONCAT44(in_stack_fffffffffffff924,in_stack_fffffffffffff920),
                          (size_type)in_stack_fffffffffffff918);
      *pvVar4 = Periodic;
      pvVar4 = std::array<amrex::LinOpBCType,_3UL>::operator[]
                         ((array<amrex::LinOpBCType,_3UL> *)
                          CONCAT44(in_stack_fffffffffffff924,in_stack_fffffffffffff920),
                          (size_type)in_stack_fffffffffffff918);
      *pvVar4 = Periodic;
    }
    else if ((local_ca & 1) == 0) {
      local_28 = *(long *)(in_RDI + 0x58);
      local_2c = local_179[2].super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                 super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
                 super__Vector_impl_data._M_finish._1_4_;
      if (*(int *)(local_28 +
                  (long)(int)local_179[2].
                             super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                             super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>
                             ._M_impl.super__Vector_impl_data._M_finish._1_4_ * 4) == 2) {
        pvVar4 = std::array<amrex::LinOpBCType,_3UL>::operator[]
                           ((array<amrex::LinOpBCType,_3UL> *)
                            CONCAT44(in_stack_fffffffffffff924,in_stack_fffffffffffff920),
                            (size_type)in_stack_fffffffffffff918);
        *pvVar4 = Dirichlet;
      }
      else {
        local_38 = *(long *)(in_RDI + 0x58);
        local_3c = local_179[2].super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                   super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl
                   .super__Vector_impl_data._M_finish._1_4_;
        if (*(int *)(local_38 +
                    (long)(int)local_179[2].
                               super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                               super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>
                               ._M_impl.super__Vector_impl_data._M_finish._1_4_ * 4) == 1) {
          pvVar4 = std::array<amrex::LinOpBCType,_3UL>::operator[]
                             ((array<amrex::LinOpBCType,_3UL> *)
                              CONCAT44(in_stack_fffffffffffff924,in_stack_fffffffffffff920),
                              (size_type)in_stack_fffffffffffff918);
          *pvVar4 = inflow;
        }
        else {
          pvVar4 = std::array<amrex::LinOpBCType,_3UL>::operator[]
                             ((array<amrex::LinOpBCType,_3UL> *)
                              CONCAT44(in_stack_fffffffffffff924,in_stack_fffffffffffff920),
                              (size_type)in_stack_fffffffffffff918);
          *pvVar4 = Neumann;
        }
      }
      local_8 = *(long *)(in_RDI + 0x58);
      local_c = local_179[2].super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
                super__Vector_impl_data._M_finish._1_4_;
      if (*(int *)(local_8 +
                  (long)(local_179[2].
                         super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                         super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                         _M_impl.super__Vector_impl_data._M_finish._1_4_ + 3) * 4) == 2) {
        pvVar4 = std::array<amrex::LinOpBCType,_3UL>::operator[]
                           ((array<amrex::LinOpBCType,_3UL> *)
                            CONCAT44(in_stack_fffffffffffff924,in_stack_fffffffffffff920),
                            (size_type)in_stack_fffffffffffff918);
        *pvVar4 = Dirichlet;
      }
      else {
        local_18 = *(long *)(in_RDI + 0x58);
        local_1c = local_179[2].super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                   super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl
                   .super__Vector_impl_data._M_finish._1_4_;
        if (*(int *)(local_18 +
                    (long)(local_179[2].
                           super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                           super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>
                           ._M_impl.super__Vector_impl_data._M_finish._1_4_ + 3) * 4) == 1) {
          pvVar4 = std::array<amrex::LinOpBCType,_3UL>::operator[]
                             ((array<amrex::LinOpBCType,_3UL> *)
                              CONCAT44(in_stack_fffffffffffff924,in_stack_fffffffffffff920),
                              (size_type)in_stack_fffffffffffff918);
          *pvVar4 = inflow;
        }
        else {
          pvVar4 = std::array<amrex::LinOpBCType,_3UL>::operator[]
                             ((array<amrex::LinOpBCType,_3UL> *)
                              CONCAT44(in_stack_fffffffffffff924,in_stack_fffffffffffff920),
                              (size_type)in_stack_fffffffffffff918);
          *pvVar4 = Neumann;
        }
      }
    }
    else {
      pvVar4 = std::array<amrex::LinOpBCType,_3UL>::operator[]
                         ((array<amrex::LinOpBCType,_3UL> *)
                          CONCAT44(in_stack_fffffffffffff924,in_stack_fffffffffffff920),
                          (size_type)in_stack_fffffffffffff918);
      *pvVar4 = Dirichlet;
      pvVar4 = std::array<amrex::LinOpBCType,_3UL>::operator[]
                         ((array<amrex::LinOpBCType,_3UL> *)
                          CONCAT44(in_stack_fffffffffffff924,in_stack_fffffffffffff920),
                          (size_type)in_stack_fffffffffffff918);
      *pvVar4 = Dirichlet;
    }
  }
  pNVar5 = (NodalProjector *)(long)local_a0;
  std::allocator<amrex::Geometry>::allocator((allocator<amrex::Geometry> *)0x82bb54);
  amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>::vector
            ((Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *)
             CONCAT44(in_stack_fffffffffffff924,in_stack_fffffffffffff920),
             (size_type)in_stack_fffffffffffff918,(allocator_type *)0x82bb71);
  std::allocator<amrex::Geometry>::~allocator((allocator<amrex::Geometry> *)0x82bb80);
  a_sigma = (Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_> *)
            (long)local_a0;
  a_vel = local_179;
  std::allocator<amrex::BoxArray>::allocator((allocator<amrex::BoxArray> *)0x82bba5);
  amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::vector
            ((Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *)
             CONCAT44(in_stack_fffffffffffff924,in_stack_fffffffffffff920),
             (size_type)in_stack_fffffffffffff918,(allocator_type *)0x82bbc2);
  std::allocator<amrex::BoxArray>::~allocator((allocator<amrex::BoxArray> *)0x82bbd1);
  a_lpinfo = (LPInfo *)(long)local_a0;
  a_geom = &local_199;
  std::allocator<amrex::DistributionMapping>::allocator
            ((allocator<amrex::DistributionMapping> *)0x82bbf6);
  amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>::vector
            ((Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_> *)
             CONCAT44(in_stack_fffffffffffff924,in_stack_fffffffffffff920),
             (size_type)in_stack_fffffffffffff918,(allocator_type *)0x82bc13);
  std::allocator<amrex::DistributionMapping>::~allocator
            ((allocator<amrex::DistributionMapping> *)0x82bc22);
  for (local_1a0 = interior; (int)local_1a0 < local_a0; local_1a0 = local_1a0 + 1) {
    pGVar3 = amrex::AmrMesh::Geom
                       ((AmrMesh *)CONCAT44(in_stack_fffffffffffff924,in_stack_fffffffffffff920),
                        (int)((ulong)in_stack_fffffffffffff918 >> 0x20));
    __dest = amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>::operator[]
                       ((Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *)
                        CONCAT44(in_stack_fffffffffffff924,in_stack_fffffffffffff920),
                        (size_type)in_stack_fffffffffffff918);
    memcpy(__dest,pGVar3,200);
    amrex::AmrMesh::boxArray
              ((AmrMesh *)CONCAT44(in_stack_fffffffffffff924,in_stack_fffffffffffff920),
               (int)((ulong)in_stack_fffffffffffff918 >> 0x20));
    amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::operator[]
              ((Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *)
               CONCAT44(in_stack_fffffffffffff924,in_stack_fffffffffffff920),
               (size_type)in_stack_fffffffffffff918);
    amrex::BoxArray::operator=
              ((BoxArray *)CONCAT44(in_stack_fffffffffffff924,in_stack_fffffffffffff920),
               in_stack_fffffffffffff918);
    amrex::Vector<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>::operator[]
              ((Vector<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_> *)
               CONCAT44(in_stack_fffffffffffff924,in_stack_fffffffffffff920),
               (size_type)in_stack_fffffffffffff918);
    this_00 = (FabArrayBase *)
              amrex::AmrLevel::get_new_data
                        ((AmrLevel *)CONCAT44(in_stack_fffffffffffff924,in_stack_fffffffffffff920),
                         (int)((ulong)in_stack_fffffffffffff918 >> 0x20));
    in_stack_fffffffffffff998 =
         (Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)
         amrex::FabArrayBase::DistributionMap(this_00);
    amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>::
    operator[]((Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_> *)
               CONCAT44(in_stack_fffffffffffff924,in_stack_fffffffffffff920),
               (size_type)in_stack_fffffffffffff918);
    amrex::DistributionMapping::operator=
              ((DistributionMapping *)CONCAT44(in_stack_fffffffffffff924,in_stack_fffffffffffff920),
               (DistributionMapping *)in_stack_fffffffffffff918);
  }
  amrex::LPInfo::LPInfo(&local_1c0);
  if (-1 < (anonymous_namespace)::max_coarsening_level) {
    amrex::LPInfo::setMaxCoarseningLevel(&local_1c0,(anonymous_namespace)::max_coarsening_level);
  }
  amrex::LPInfo::setAgglomeration(&local_1c0,(bool)((anonymous_namespace)::agglomeration & 1));
  amrex::LPInfo::setConsolidation(&local_1c0,(bool)((anonymous_namespace)::consolidation & 1));
  local_1e8 = (pointer)std::vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::begin
                                 ((vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)
                                  in_stack_fffffffffffff918);
  local_1e0 = (pointer)__gnu_cxx::
                       __normal_iterator<amrex::MultiFab_*const_*,_std::vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>_>
                       ::operator+((__normal_iterator<amrex::MultiFab_*const_*,_std::vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>_>
                                    *)in_stack_fffffffffffff928._M_current,
                                   CONCAT44(in_stack_fffffffffffff924,in_stack_fffffffffffff920));
  local_200 = (MultiFab **)
              std::vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::begin
                        ((vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)
                         in_stack_fffffffffffff918);
  local_1f8 = (pointer)__gnu_cxx::
                       __normal_iterator<amrex::MultiFab_*const_*,_std::vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>_>
                       ::operator+((__normal_iterator<amrex::MultiFab_*const_*,_std::vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>_>
                                    *)in_stack_fffffffffffff928._M_current,
                                   CONCAT44(in_stack_fffffffffffff924,in_stack_fffffffffffff920));
  local_1f0 = (pointer)__gnu_cxx::
                       __normal_iterator<amrex::MultiFab_*const_*,_std::vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>_>
                       ::operator+((__normal_iterator<amrex::MultiFab_*const_*,_std::vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>_>
                                    *)in_stack_fffffffffffff928._M_current,
                                   CONCAT44(in_stack_fffffffffffff924,in_stack_fffffffffffff920));
  std::allocator<amrex::MultiFab_*>::allocator((allocator<amrex::MultiFab_*> *)0x82bea5);
  amrex::Vector<amrex::MultiFab*,std::allocator<amrex::MultiFab*>>::
  vector<__gnu_cxx::__normal_iterator<amrex::MultiFab*const*,std::vector<amrex::MultiFab*,std::allocator<amrex::MultiFab*>>>,void>
            ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)
             CONCAT44(in_stack_fffffffffffff924,in_stack_fffffffffffff920),in_stack_fffffffffffff930
             ,in_stack_fffffffffffff928,(allocator_type *)in_stack_fffffffffffff918);
  std::allocator<amrex::MultiFab_*>::~allocator((allocator<amrex::MultiFab_*> *)0x82bed6);
  local_230 = (MultiFab **)
              std::vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::begin
                        ((vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)
                         in_stack_fffffffffffff918);
  local_228 = (MultiFab **)
              __gnu_cxx::
              __normal_iterator<amrex::MultiFab_*const_*,_std::vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>_>
              ::operator+(in_stack_fffffffffffff928._M_current,
                          CONCAT44(in_stack_fffffffffffff924,in_stack_fffffffffffff920));
  local_248 = (MultiFab **)
              std::vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::begin
                        ((vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)
                         in_stack_fffffffffffff918);
  local_240 = (MultiFab **)
              __gnu_cxx::
              __normal_iterator<amrex::MultiFab_*const_*,_std::vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>_>
              ::operator+(in_stack_fffffffffffff928._M_current,
                          CONCAT44(in_stack_fffffffffffff924,in_stack_fffffffffffff920));
  local_238 = (MultiFab **)
              __gnu_cxx::
              __normal_iterator<amrex::MultiFab_*const_*,_std::vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>_>
              ::operator+(in_stack_fffffffffffff928._M_current,
                          CONCAT44(in_stack_fffffffffffff924,in_stack_fffffffffffff920));
  this_03 = (NodalProjector *)(local_2b0 + 0x67);
  std::allocator<amrex::MultiFab_*>::allocator((allocator<amrex::MultiFab_*> *)0x82bf69);
  amrex::Vector<amrex::MultiFab*,std::allocator<amrex::MultiFab*>>::
  vector<__gnu_cxx::__normal_iterator<amrex::MultiFab*const*,std::vector<amrex::MultiFab*,std::allocator<amrex::MultiFab*>>>,void>
            ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)
             CONCAT44(in_stack_fffffffffffff924,in_stack_fffffffffffff920),in_stack_fffffffffffff930
             ,in_stack_fffffffffffff928,(allocator_type *)in_stack_fffffffffffff918);
  std::allocator<amrex::MultiFab_*>::~allocator((allocator<amrex::MultiFab_*> *)0x82bf9a);
  local_2b0._56_8_ =
       std::vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::begin
                 ((vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)
                  in_stack_fffffffffffff918);
  local_2b0._64_8_ =
       __gnu_cxx::
       __normal_iterator<amrex::MultiFab_*const_*,_std::vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>_>
       ::operator+((__normal_iterator<amrex::MultiFab_*const_*,_std::vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>_>
                    *)in_stack_fffffffffffff928._M_current,
                   CONCAT44(in_stack_fffffffffffff924,in_stack_fffffffffffff920));
  local_2b0._32_8_ =
       std::vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::begin
                 ((vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)
                  in_stack_fffffffffffff918);
  local_2b0._40_8_ =
       __gnu_cxx::
       __normal_iterator<amrex::MultiFab_*const_*,_std::vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>_>
       ::operator+((__normal_iterator<amrex::MultiFab_*const_*,_std::vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>_>
                    *)in_stack_fffffffffffff928._M_current,
                   CONCAT44(in_stack_fffffffffffff924,in_stack_fffffffffffff920));
  local_2b0._48_8_ =
       __gnu_cxx::
       __normal_iterator<amrex::MultiFab_*const_*,_std::vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>_>
       ::operator+((__normal_iterator<amrex::MultiFab_*const_*,_std::vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>_>
                    *)in_stack_fffffffffffff928._M_current,
                   CONCAT44(in_stack_fffffffffffff924,in_stack_fffffffffffff920));
  a_phi = (Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)(local_2b0 + 0x1f);
  std::allocator<amrex::MultiFab_*>::allocator((allocator<amrex::MultiFab_*> *)0x82c02d);
  amrex::Vector<amrex::MultiFab*,std::allocator<amrex::MultiFab*>>::
  vector<__gnu_cxx::__normal_iterator<amrex::MultiFab*const*,std::vector<amrex::MultiFab*,std::allocator<amrex::MultiFab*>>>,void>
            ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)
             CONCAT44(in_stack_fffffffffffff924,in_stack_fffffffffffff920),in_stack_fffffffffffff930
             ,in_stack_fffffffffffff928,(allocator_type *)in_stack_fffffffffffff918);
  std::allocator<amrex::MultiFab_*>::~allocator((allocator<amrex::MultiFab_*> *)0x82c05e);
  amrex::Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>::Vector
            ((Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_> *)0x82c06b);
  amrex::Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::Vector
            ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)0x82c078);
  bVar1 = std::vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::empty
                    ((vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)
                     in_stack_fffffffffffff930._M_current);
  if (!bVar1) {
    std::vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::begin
              ((vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)
               in_stack_fffffffffffff918);
    __gnu_cxx::
    __normal_iterator<amrex::MultiFab_*const_*,_std::vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>_>
    ::operator+((__normal_iterator<amrex::MultiFab_*const_*,_std::vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>_>
                 *)in_stack_fffffffffffff928._M_current,
                CONCAT44(in_stack_fffffffffffff924,in_stack_fffffffffffff920));
    std::vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::begin
              ((vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)
               in_stack_fffffffffffff918);
    __gnu_cxx::
    __normal_iterator<amrex::MultiFab_*const_*,_std::vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>_>
    ::operator+((__normal_iterator<amrex::MultiFab_*const_*,_std::vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>_>
                 *)in_stack_fffffffffffff928._M_current,
                CONCAT44(in_stack_fffffffffffff924,in_stack_fffffffffffff920));
    __gnu_cxx::
    __normal_iterator<amrex::MultiFab_*const_*,_std::vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>_>
    ::operator+((__normal_iterator<amrex::MultiFab_*const_*,_std::vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>_>
                 *)in_stack_fffffffffffff928._M_current,
                CONCAT44(in_stack_fffffffffffff924,in_stack_fffffffffffff920));
    __last._M_current._4_4_ = in_stack_fffffffffffff93c;
    __last._M_current._0_4_ = in_stack_fffffffffffff938;
    std::vector<amrex::MultiFab_const*,std::allocator<amrex::MultiFab_const*>>::
    assign<__gnu_cxx::__normal_iterator<amrex::MultiFab*const*,std::vector<amrex::MultiFab*,std::allocator<amrex::MultiFab*>>>,void>
              ((vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_> *)
               in_stack_fffffffffffff930._M_current,in_stack_fffffffffffff940,__last);
  }
  bVar1 = std::vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::empty
                    ((vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)
                     in_stack_fffffffffffff930._M_current);
  if (!bVar1) {
    std::vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::begin
              ((vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)
               in_stack_fffffffffffff918);
    __gnu_cxx::
    __normal_iterator<amrex::MultiFab_*const_*,_std::vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>_>
    ::operator+((__normal_iterator<amrex::MultiFab_*const_*,_std::vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>_>
                 *)in_stack_fffffffffffff928._M_current,
                CONCAT44(in_stack_fffffffffffff924,in_stack_fffffffffffff920));
    std::vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::begin
              ((vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)
               in_stack_fffffffffffff918);
    __gnu_cxx::
    __normal_iterator<amrex::MultiFab_*const_*,_std::vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>_>
    ::operator+((__normal_iterator<amrex::MultiFab_*const_*,_std::vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>_>
                 *)in_stack_fffffffffffff928._M_current,
                CONCAT44(in_stack_fffffffffffff924,in_stack_fffffffffffff920));
    __gnu_cxx::
    __normal_iterator<amrex::MultiFab_*const_*,_std::vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>_>
    ::operator+((__normal_iterator<amrex::MultiFab_*const_*,_std::vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>_>
                 *)in_stack_fffffffffffff928._M_current,
                CONCAT44(in_stack_fffffffffffff924,in_stack_fffffffffffff920));
    __last_00._M_current._4_4_ = in_stack_fffffffffffff93c;
    __last_00._M_current._0_4_ = in_stack_fffffffffffff938;
    std::vector<amrex::MultiFab*,std::allocator<amrex::MultiFab*>>::
    assign<__gnu_cxx::__normal_iterator<amrex::MultiFab*const*,std::vector<amrex::MultiFab*,std::allocator<amrex::MultiFab*>>>,void>
              ((vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)
               in_stack_fffffffffffff930._M_current,in_stack_fffffffffffff940,__last_00);
  }
  amrex::GetVecOfConstPtrs<amrex::MultiFab,amrex::FabArray<amrex::FArrayBox>::FABType>
            (in_stack_fffffffffffff958);
  this_02 = (NodalProjector *)local_2b0;
  Hydro::NodalProjector::NodalProjector
            (pNVar5,a_vel,a_sigma,a_geom,a_lpinfo,in_stack_fffffffffffff998,a_S_nd);
  amrex::Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>::~Vector
            ((Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_> *)0x82c2dd);
  local_4e8 = local_128;
  local_4f0 = local_130;
  local_4f8 = stack0xfffffffffffffecc;
  local_500 = local_179[2].super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
              super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
              super__Vector_impl_data._13_8_;
  local_508 = local_128;
  local_510 = local_130;
  local_518 = stack0xfffffffffffffecc;
  local_520 = local_179[2].super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
              super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
              super__Vector_impl_data._13_8_;
  a_bc_lo._M_elems[1] = (int)in_stack_fffffffffffff950;
  a_bc_lo._M_elems[2] = (int)((ulong)in_stack_fffffffffffff950 >> 0x20);
  a_bc_lo._M_elems[0] = in_stack_fffffffffffff94c;
  a_bc_hi._M_elems[2] = in_stack_fffffffffffff938;
  a_bc_hi._M_elems._0_8_ = in_stack_fffffffffffff930._M_current;
  Hydro::NodalProjector::setDomainBC(this_02,a_bc_lo,a_bc_hi);
  pMVar6 = Hydro::NodalProjector::getLinOp
                     ((NodalProjector *)
                      CONCAT44(in_stack_fffffffffffff924,in_stack_fffffffffffff920));
  amrex::MLNodeLaplacian::setGaussSeidel(pMVar6,(bool)((anonymous_namespace)::use_gauss_seidel & 1))
  ;
  pMVar6 = Hydro::NodalProjector::getLinOp
                     ((NodalProjector *)
                      CONCAT44(in_stack_fffffffffffff924,in_stack_fffffffffffff920));
  amrex::MLNodeLaplacian::setHarmonicAverage
            (pMVar6,(bool)((anonymous_namespace)::use_harmonic_average & 1));
  this_01 = Hydro::NodalProjector::getMLMG
                      ((NodalProjector *)
                       CONCAT44(in_stack_fffffffffffff924,in_stack_fffffffffffff920));
  amrex::MLMG::setMaxFmgIter(this_01,(anonymous_namespace)::max_fmg_iter);
  if (in_stack_00000028 != (MultiFab *)0x0) {
    Hydro::NodalProjector::setSyncResidualFine
              ((NodalProjector *)&stack0xfffffffffffffb38,in_stack_00000028);
  }
  if (in_stack_00000020 != 0.0) {
    IVar8 = amrex::AmrMesh::refRatio
                      ((AmrMesh *)in_stack_fffffffffffff930._M_current,
                       (int)((ulong)in_stack_fffffffffffff928._M_current >> 0x20));
    local_540[2] = IVar8.vect[2];
    local_528 = local_540[2];
    local_540._0_8_ = IVar8.vect._0_8_;
    local_530._0_4_ = local_540[0];
    local_530._4_4_ = local_540[1];
    local_540 = IVar8.vect;
    amrex::AmrMesh::boxArray
              ((AmrMesh *)CONCAT44(in_stack_fffffffffffff924,in_stack_fffffffffffff920),
               (int)((ulong)this_02 >> 0x20));
    amrex::BoxArray::BoxArray
              ((BoxArray *)CONCAT44(in_stack_fffffffffffff924,in_stack_fffffffffffff920),
               (BoxArray *)this_02);
    local_5b0 = local_528;
    local_5b8 = local_530;
    IVar8.vect[1] = (int)in_stack_fffffffffffff950;
    IVar8.vect[2] = (int)((ulong)in_stack_fffffffffffff950 >> 0x20);
    IVar8.vect[0] = in_stack_fffffffffffff94c;
    Hydro::NodalProjector::setSyncResidualCrse
              ((NodalProjector *)in_stack_fffffffffffff930._M_current,
               (MultiFab *)in_stack_fffffffffffff928._M_current,IVar8,
               (BoxArray *)CONCAT44(in_stack_fffffffffffff924,in_stack_fffffffffffff920));
    amrex::BoxArray::~BoxArray
              ((BoxArray *)CONCAT44(in_stack_fffffffffffff924,in_stack_fffffffffffff920));
    in_stack_fffffffffffff960 = in_stack_00000020;
  }
  Hydro::NodalProjector::project
            (this_03,a_phi,in_stack_fffffffffffff960,(Real)in_stack_fffffffffffff958);
  Hydro::NodalProjector::getGradPhi(this_02);
  for (local_5d4 = 0; local_5d4 < local_a0; local_5d4 = local_5d4 + 1) {
    ppAVar7 = amrex::Vector<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>::operator[]
                        ((Vector<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_> *)
                         CONCAT44(in_stack_fffffffffffff924,in_stack_fffffffffffff920),
                         (size_type)this_02);
    if (*ppAVar7 == (AmrLevel *)0x0) {
      dst = (MultiFab *)0x0;
      pNVar5 = (NodalProjector *)in_stack_fffffffffffff940._M_current;
    }
    else {
      dst = (MultiFab *)
            __dynamic_cast(*ppAVar7,&amrex::AmrLevel::typeinfo,&NavierStokesBase::typeinfo,0);
      pNVar5 = (NodalProjector *)in_stack_fffffffffffff940._M_current;
    }
    local_5e0 = dst;
    in_stack_fffffffffffff940._M_current =
         (MultiFab **)
         amrex::AmrLevel::get_new_data
                   ((AmrLevel *)CONCAT44(in_stack_fffffffffffff924,in_stack_fffffffffffff920),
                    (int)((ulong)this_02 >> 0x20));
    local_5e8 = (NodalProjector *)in_stack_fffffffffffff940._M_current;
    if ((local_c9 & 1) == 0) {
      amrex::Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::operator[]
                ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)
                 CONCAT44(in_stack_fffffffffffff924,in_stack_fffffffffffff920),(size_type)this_02);
      amrex::MultiFab::Copy
                (dst,(MultiFab *)CONCAT44(in_stack_fffffffffffff94c,in_stack_fffffffffffff948),
                 (int)((ulong)in_stack_fffffffffffff940._M_current >> 0x20),
                 (int)in_stack_fffffffffffff940._M_current,in_stack_fffffffffffff93c,
                 in_stack_fffffffffffff938);
    }
    else {
      in_stack_fffffffffffff948 = SUB84(in_stack_fffffffffffff940._M_current,0);
      in_stack_fffffffffffff94c = (LinOpBCType)((ulong)in_stack_fffffffffffff940._M_current >> 0x20)
      ;
      amrex::Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::operator[]
                ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)
                 CONCAT44(in_stack_fffffffffffff924,in_stack_fffffffffffff920),(size_type)this_02);
      amrex::MultiFab::Add
                ((MultiFab *)in_stack_fffffffffffff930._M_current,
                 (MultiFab *)in_stack_fffffffffffff928._M_current,in_stack_fffffffffffff924,
                 in_stack_fffffffffffff920,(int)((ulong)this_02 >> 0x20),(int)this_02);
      in_stack_fffffffffffff940._M_current = (MultiFab **)pNVar5;
    }
    amrex::Vector<amrex::StateData,_std::allocator<amrex::StateData>_>::operator[]
              ((Vector<amrex::StateData,_std::allocator<amrex::StateData>_> *)
               CONCAT44(in_stack_fffffffffffff924,in_stack_fffffffffffff920),(size_type)this_02);
    local_5f8 = amrex::StateData::curTime((StateData *)in_stack_fffffffffffff940._M_current);
    local_5f0 = &local_5f8;
    in_stack_fffffffffffff93c = 0;
    in_stack_fffffffffffff928._M_current = (MultiFab **)local_5e0;
    in_stack_fffffffffffff930._M_current = (MultiFab **)local_5e8;
    amrex::FabArrayBase::nGrow((FabArrayBase *)local_5e8,0);
    this_02 = (NodalProjector *)((ulong)this_02 & 0xffffffff00000000);
    amrex::AmrLevel::FillPatch
              (in_stack_fffffffffffffb70,(MultiFab *)in_stack_fffffffffffffb68,
               in_stack_fffffffffffffb64,(Real)in_stack_fffffffffffffb58,in_stack_fffffffffffffb54,
               in_stack_fffffffffffffb50,in_stack_fffffffffffffb4c,in_stack_fffffffffffffb80);
  }
  amrex::Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::~Vector
            ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)0x82c79f);
  Hydro::NodalProjector::~NodalProjector
            ((NodalProjector *)CONCAT44(in_stack_fffffffffffff924,in_stack_fffffffffffff920));
  amrex::Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::~Vector
            ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)0x82c7b9);
  amrex::Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>::~Vector
            ((Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_> *)0x82c7c6);
  amrex::Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::~Vector
            ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)0x82c7d3);
  amrex::Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::~Vector
            ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)0x82c7e0);
  amrex::Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::~Vector
            ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)0x82c7ed);
  amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>::~Vector
            ((Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_> *)
             0x82c7fa);
  amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::~Vector
            ((Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *)0x82c807);
  amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>::~Vector
            ((Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *)0x82c814);
  amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>::~Vector
            ((Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_> *)0x82c821);
  amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>::~Vector
            ((Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_> *)0x82c82e);
  return;
}

Assistant:

void Projection::doMLMGNodalProjection (int c_lev, int nlevel,
                                        const Vector<MultiFab*>& vel,
                                        const Vector<MultiFab*>& phi,
                                        const Vector<MultiFab*>& sig,
                                        const Vector<MultiFab*>& rhcc,
                                        const Vector<MultiFab*>& rhnd,
                                        Real rel_tol, Real abs_tol,
                                        bool increment_gp,
                                        MultiFab* sync_resid_crse,
                                        MultiFab* sync_resid_fine,
                                        bool doing_initial_vortproj)
{
    BL_PROFILE("Projection:::doMLMGNodalProjection()");

    int f_lev = c_lev + nlevel - 1;

    Vector<MultiFab> vel_test(nlevel);
    Vector<MultiFab> phi_test(nlevel);

    AMREX_ASSERT(vel[c_lev]->nGrow() >= 1);
    AMREX_ASSERT(vel[f_lev]->nGrow() >= 1);
    AMREX_ASSERT(phi[c_lev]->nGrow() == 1);
    AMREX_ASSERT(phi[f_lev]->nGrow() == 1);
    // MLMG does not copy any ghost cells from sig, rhcc or rhnd; fills ghost cells internally
    // AMREX_ASSERT(sig[c_lev]->nGrow() == 1);
    // AMREX_ASSERT(sig[f_lev]->nGrow() == 1);

    AMREX_ASSERT(sig[c_lev]->nComp() == 1);
    AMREX_ASSERT(sig[f_lev]->nComp() == 1);

    if (sync_resid_crse != 0) {
        AMREX_ASSERT(nlevel == 1);
        AMREX_ASSERT(c_lev < parent->finestLevel());
    }

    if (sync_resid_fine != 0) {
        AMREX_ASSERT((nlevel == 1 || nlevel == 2));
        AMREX_ASSERT(c_lev > 0);
    }

    if (!rhcc.empty() )
        AMREX_ALWAYS_ASSERT(rhcc[c_lev]->boxArray().ixType().cellCentered());

    if (!rhnd.empty() )
        AMREX_ALWAYS_ASSERT(rhnd[c_lev]->boxArray().ixType().nodeCentered());

    set_boundary_velocity(c_lev, nlevel, vel, true);

    std::array<LinOpBCType,AMREX_SPACEDIM> mlmg_lobc;
    std::array<LinOpBCType,AMREX_SPACEDIM> mlmg_hibc;
    for (int idim = 0; idim < AMREX_SPACEDIM; ++idim)
    {
        if (parent->Geom(c_lev).isPeriodic(idim))
        {
            mlmg_lobc[idim] = mlmg_hibc[idim] = LinOpBCType::Periodic;
        }
        else if (doing_initial_vortproj)
        {
            mlmg_lobc[idim] = mlmg_hibc[idim] = LinOpBCType::Dirichlet;
        }
        else
        {
            if (phys_bc->lo(idim) == Outflow) {
                mlmg_lobc[idim] = LinOpBCType::Dirichlet;
            } else if (phys_bc->lo(idim) == Inflow) {
                mlmg_lobc[idim] = LinOpBCType::inflow;
            } else {
                mlmg_lobc[idim] = LinOpBCType::Neumann;
            }

            if (phys_bc->hi(idim) == Outflow) {
                mlmg_hibc[idim] = LinOpBCType::Dirichlet;
            } else if (phys_bc->hi(idim) == Inflow) {
                mlmg_hibc[idim] = LinOpBCType::inflow;
            } else {
                mlmg_hibc[idim] = LinOpBCType::Neumann;
            }
        }
    }

    //
    // Setup objects for projection
    //
    Vector<Geometry>            mg_geom(nlevel);
    Vector<BoxArray>            mg_grids(nlevel);
    Vector<DistributionMapping> mg_dmap(nlevel);

    for (int lev(0); lev < nlevel; lev++)
    {
        mg_geom[lev] = parent->Geom(lev+c_lev);
        mg_grids[lev] = parent->boxArray(lev+c_lev);
        mg_dmap[lev] = LevelData[lev+c_lev]->get_new_data(State_Type).DistributionMap();
    }

    // Setup infos to pass to linear operator
    LPInfo info;

    if (max_coarsening_level >= 0 ) {
	info.setMaxCoarseningLevel(max_coarsening_level);
    }
    info.setAgglomeration(agglomeration);
    info.setConsolidation(consolidation);
    // metric term stuff doesn't get used at all for nodal
    //info.setMetricTerm(false);

    //
    // Setup variables to use in projection
    //
    Vector<MultiFab*> phi_rebase(phi.begin()+c_lev, phi.begin()+c_lev+nlevel);
    Vector<MultiFab*> vel_rebase{vel.begin()+c_lev, vel.begin()+c_lev+nlevel};
    Vector<MultiFab*> sigma_rebase(sig.begin()+c_lev, sig.begin()+c_lev+nlevel);

    Vector<const MultiFab*> rhnd_rebase;
    Vector<MultiFab*> rhcc_rebase;

    if (!rhnd.empty())
    {
        rhnd_rebase.assign(rhnd.begin()+c_lev, rhnd.begin()+c_lev+nlevel);
    }

    if (!rhcc.empty())
    {
        rhcc_rebase.assign(rhcc.begin()+c_lev, rhcc.begin()+c_lev+nlevel);
    }

    // Setup nodal projector object
    Hydro::NodalProjector nodal_projector(vel_rebase, GetVecOfConstPtrs(sigma_rebase), mg_geom, info, rhcc_rebase, rhnd_rebase);
    nodal_projector.setDomainBC(mlmg_lobc, mlmg_hibc);

// WARNING: we set the strategy to Sigma to get exactly the same results as the no EB code
// when we don't have interior geometry
//  nodal_projector.getLinOp().setCoarseningStrategy(MLNodeLaplacian::CoarseningStrategy::Sigma);

    // MLNodeLaplacian.define() will set is_rz based on geom.

    nodal_projector.getLinOp().setGaussSeidel(use_gauss_seidel);
    nodal_projector.getLinOp().setHarmonicAverage(use_harmonic_average);
    nodal_projector.getMLMG().setMaxFmgIter(max_fmg_iter);

    if (sync_resid_fine != 0)
    {
        nodal_projector.setSyncResidualFine(sync_resid_fine);
    }
    if (sync_resid_crse != 0)
    {
        nodal_projector.setSyncResidualCrse(sync_resid_crse, parent->refRatio(c_lev), parent->boxArray(c_lev+1));
    }

    //
    // Project to get new P and update velocity
    //
    nodal_projector.project(phi_rebase,rel_tol,abs_tol);

    //
    // Update gradP
    //
    const auto gradphi = nodal_projector.getGradPhi();

    for (int lev = 0; lev < nlevel; lev++)
    {
      NavierStokesBase& ns = *dynamic_cast<NavierStokesBase*>(LevelData[lev+c_lev]);
      MultiFab& Gp = ns.get_new_data(Gradp_Type);

      if ( increment_gp )
      {
	//
	// Add a correction to Gradp
	//
        MultiFab::Add(Gp, *gradphi[lev], 0, 0, AMREX_SPACEDIM, 0);
      }
      else
      {
	//
	// Replace Gradp with the gradient(P) computed in MLMG
	//
	MultiFab::Copy(Gp, *gradphi[lev], 0, 0, AMREX_SPACEDIM, 0);

      }
      //
      // FIXME - could we get away with only FillPatching in predict_velocity
      // and initialPressureProject? I think this would depend on the definition
      // of properly nested... For now, be safe and just fill them.
      // Fill ghost cells
      //
      const Real& time = (ns.state)[Gradp_Type].curTime();
      NavierStokesBase::FillPatch(ns, Gp, Gp.nGrow(), time, Gradp_Type, 0, AMREX_SPACEDIM);
    }
}